

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

Token * __thiscall toml::internal::Lexer::nextStringDoubleQuote(Lexer *this)

{
  bool bVar1;
  Token *in_RDI;
  int i;
  string codepoint;
  int size;
  bool multiline;
  char c;
  string s;
  Lexer *in_stack_fffffffffffffe10;
  allocator *paVar2;
  undefined6 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1e;
  undefined1 in_stack_fffffffffffffe1f;
  string *in_stack_fffffffffffffe20;
  undefined1 uVar3;
  TokenType in_stack_fffffffffffffe2c;
  undefined2 uVar5;
  Token *in_stack_fffffffffffffe30;
  bool local_1b3;
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [32];
  string local_130 [39];
  undefined1 local_109 [37];
  int local_e4;
  string local_e0 [32];
  int local_c0;
  allocator local_b9;
  string local_b8 [36];
  int local_94;
  string local_90 [38];
  byte local_6a;
  char local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [8];
  string *in_stack_ffffffffffffffd8;
  undefined4 uVar4;
  
  bVar1 = consume((Lexer *)CONCAT17(in_stack_fffffffffffffe1f,
                                    CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)),
                  (char)((ulong)in_stack_fffffffffffffe10 >> 0x38));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"string didn\'t start with \'\"\'",&local_31);
    Token::Token(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    return in_RDI;
  }
  std::__cxx11::string::string(local_68);
  local_6a = 0;
  bVar1 = current((Lexer *)CONCAT17(in_stack_fffffffffffffe1f,
                                    CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)),
                  (char *)in_stack_fffffffffffffe10);
  if ((bVar1) && (local_69 == '\"')) {
    next(in_stack_fffffffffffffe10);
    bVar1 = current((Lexer *)CONCAT17(in_stack_fffffffffffffe1f,
                                      CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18))
                    ,(char *)in_stack_fffffffffffffe10);
    if ((!bVar1) || (local_69 != '\"')) {
      std::__cxx11::string::string(local_90);
      Token::Token(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
      std::__cxx11::string::~string(local_90);
      local_94 = 1;
LAB_0017f72f:
      std::__cxx11::string::~string(local_68);
      return in_RDI;
    }
    next(in_stack_fffffffffffffe10);
    while( true ) {
      bVar1 = current((Lexer *)CONCAT17(in_stack_fffffffffffffe1f,
                                        CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18
                                                )),(char *)in_stack_fffffffffffffe10);
      local_1b3 = false;
      if (bVar1) {
        local_1b3 = local_69 == ' ' || local_69 == '\t';
      }
      if (!local_1b3) break;
      next(in_stack_fffffffffffffe10);
    }
    bVar1 = current((Lexer *)CONCAT17(in_stack_fffffffffffffe1f,
                                      CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18))
                    ,(char *)in_stack_fffffffffffffe10);
    if ((bVar1) && (local_69 == '\n')) {
      next(in_stack_fffffffffffffe10);
    }
    local_6a = 1;
  }
LAB_0017ef6f:
  while( true ) {
    while( true ) {
      bVar1 = current((Lexer *)CONCAT17(in_stack_fffffffffffffe1f,
                                        CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18
                                                )),(char *)in_stack_fffffffffffffe10);
      if (!bVar1) {
        paVar2 = &local_179;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_178,"string didn\'t end",paVar2);
        Token::Token(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
        std::__cxx11::string::~string(local_178);
        std::allocator<char>::~allocator((allocator<char> *)&local_179);
        local_94 = 1;
        goto LAB_0017f72f;
      }
      next(in_stack_fffffffffffffe10);
      if (local_69 == '\\') break;
      if (local_69 != '\"') goto LAB_0017f66c;
      if ((local_6a & 1) == 0) {
        Token::Token(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
        local_94 = 1;
        goto LAB_0017f72f;
      }
      in_stack_fffffffffffffe1f =
           current((Lexer *)CONCAT17(in_stack_fffffffffffffe1f,
                                     CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)),
                   (char *)in_stack_fffffffffffffe10);
      if (((bool)in_stack_fffffffffffffe1f) && (local_69 == '\"')) {
        next(in_stack_fffffffffffffe10);
        in_stack_fffffffffffffe1e =
             current((Lexer *)CONCAT17(in_stack_fffffffffffffe1f,
                                       CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)
                                      ),(char *)in_stack_fffffffffffffe10);
        if (((bool)in_stack_fffffffffffffe1e) && (local_69 == '\"')) {
          next(in_stack_fffffffffffffe10);
          Token::Token(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20
                      );
          local_94 = 1;
          goto LAB_0017f72f;
        }
        std::__cxx11::string::operator+=(local_68,'\"');
        std::__cxx11::string::operator+=(local_68,'\"');
      }
      else {
        std::__cxx11::string::operator+=(local_68,'\"');
      }
    }
    bVar1 = current((Lexer *)CONCAT17(in_stack_fffffffffffffe1f,
                                      CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18))
                    ,(char *)in_stack_fffffffffffffe10);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"string has unknown escape sequence",&local_b9);
      Token::Token(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      local_94 = 1;
      goto LAB_0017f72f;
    }
    next(in_stack_fffffffffffffe10);
    if (local_69 != '\n') break;
    while( true ) {
      bVar1 = current((Lexer *)CONCAT17(in_stack_fffffffffffffe1f,
                                        CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18
                                                )),(char *)in_stack_fffffffffffffe10);
      in_stack_fffffffffffffe2c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe2c) & 0xff00ffff;
      if (bVar1) {
        uVar5 = (undefined2)(in_stack_fffffffffffffe2c >> 0x10);
        uVar3 = (undefined1)in_stack_fffffffffffffe2c;
        uVar4 = CONCAT22(uVar5,CONCAT11(1,uVar3));
        if (((local_69 != ' ') && (uVar4 = CONCAT22(uVar5,CONCAT11(1,uVar3)), local_69 != '\t')) &&
           (uVar4 = CONCAT22(uVar5,CONCAT11(1,uVar3)), local_69 != '\r')) {
          uVar4 = CONCAT22(uVar5,CONCAT11(local_69 == '\n',uVar3));
        }
        in_stack_fffffffffffffe2c =
             CONCAT13((char)((uint)uVar4 >> 0x18),CONCAT12((char)((uint)uVar4 >> 8),(short)uVar4));
      }
      if ((char)(in_stack_fffffffffffffe2c >> 0x10) == '\0') break;
      next(in_stack_fffffffffffffe10);
    }
  }
  if (local_69 == '\"') {
    local_69 = '\"';
  }
  else {
    if (local_69 == '\'') {
      local_69 = '\'';
      goto LAB_0017f66c;
    }
    if (local_69 == 'U') {
LAB_0017f13e:
      local_c0 = 8;
      if (local_69 == 'u') {
        local_c0 = 4;
      }
      std::__cxx11::string::string(local_e0);
      for (local_e4 = 0; local_e4 < local_c0; local_e4 = local_e4 + 1) {
        bVar1 = current((Lexer *)CONCAT17(in_stack_fffffffffffffe1f,
                                          CONCAT16(in_stack_fffffffffffffe1e,
                                                   in_stack_fffffffffffffe18)),
                        (char *)in_stack_fffffffffffffe10);
        if ((!bVar1) ||
           ((((local_69 < '0' || ('9' < local_69)) && ((local_69 < 'A' || ('F' < local_69)))) &&
            ((local_69 < 'a' || ('f' < local_69)))))) {
          in_stack_fffffffffffffe30 = (Token *)local_109;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_109 + 1),"string has unknown escape sequence",
                     (allocator *)in_stack_fffffffffffffe30);
          Token::Token(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20
                      );
          std::__cxx11::string::~string((string *)(local_109 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_109);
          local_94 = 1;
          goto LAB_0017f382;
        }
        std::__cxx11::string::operator+=(local_e0,local_69);
        next(in_stack_fffffffffffffe10);
      }
      unescape(in_stack_ffffffffffffffd8);
      std::__cxx11::string::operator+=(local_68,local_130);
      std::__cxx11::string::~string(local_130);
      local_94 = 4;
LAB_0017f382:
      std::__cxx11::string::~string(local_e0);
      if (local_94 != 4) goto LAB_0017f72f;
      goto LAB_0017ef6f;
    }
    if (local_69 == '\\') {
      local_69 = '\\';
    }
    else if (local_69 == 'n') {
      local_69 = '\n';
    }
    else {
      if (local_69 == 'r') {
        local_69 = '\r';
        goto LAB_0017f66c;
      }
      if (local_69 != 't') {
        if (local_69 == 'u') goto LAB_0017f13e;
        paVar2 = &local_151;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_150,"string has unknown escape sequence",paVar2);
        Token::Token(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,(string *)paVar2);
        std::__cxx11::string::~string(local_150);
        std::allocator<char>::~allocator((allocator<char> *)&local_151);
        local_94 = 1;
        goto LAB_0017f72f;
      }
      local_69 = '\t';
    }
  }
LAB_0017f66c:
  std::__cxx11::string::operator+=(local_68,local_69);
  goto LAB_0017ef6f;
}

Assistant:

inline Token Lexer::nextStringDoubleQuote()
{
    if (!consume('"'))
        return Token(TokenType::ERROR_TOKEN, std::string("string didn't start with '\"'"));

    std::string s;
    char c;
    bool multiline = false;

    if (current(&c) && c == '"') {
        next();
        if (!current(&c) || c != '"') {
            // OK. It's empty string.
            return Token(TokenType::STRING, std::string());
        }

        next();
        // raw string literal started.
        // Newline just after """ should be ignored.
        while (current(&c) && (c == ' ' || c == '\t'))
            next();
        if (current(&c) && c == '\n')
            next();
        multiline = true;
    }

    while (current(&c)) {
        next();
        if (c == '\\') {
            if (!current(&c))
                return Token(TokenType::ERROR_TOKEN, std::string("string has unknown escape sequence"));
            next();
            switch (c) {
            case 't': c = '\t'; break;
            case 'n': c = '\n'; break;
            case 'r': c = '\r'; break;
            case 'u':
            case 'U': {
                int size = c == 'u' ? 4 : 8;
                std::string codepoint;
                for (int i = 0; i < size; ++i) {
                  if (current(&c) && (('0' <= c && c <= '9') || ('A' <= c && c <= 'F') || ('a' <= c && c <= 'f'))) {
                    codepoint += c;
                    next();
                  } else {
                    return Token(TokenType::ERROR_TOKEN, std::string("string has unknown escape sequence"));
                  }
                }
                s += unescape(codepoint);
                continue;
            }
            case '"': c = '"'; break;
            case '\'': c = '\''; break;
            case '\\': c = '\\'; break;
            case '\n':
                while (current(&c) && (c == ' ' || c == '\t' || c == '\r' || c == '\n')) {
                    next();
                }
                continue;
            default:
                return Token(TokenType::ERROR_TOKEN, std::string("string has unknown escape sequence"));
            }
        } else if (c == '"') {
            if (multiline) {
                if (current(&c) && c == '"') {
                    next();
                    if (current(&c) && c == '"') {
                        next();
                        return Token(TokenType::MULTILINE_STRING, s);
                    } else {
                        s += '"';
                        s += '"';
                        continue;
                    }
                } else {
                    s += '"';
                    continue;
                }
            } else {
                return Token(TokenType::STRING, s);
            }
        }

        s += c;
    }

    return Token(TokenType::ERROR_TOKEN, std::string("string didn't end"));
}